

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void slang::ast::DefParamSymbol::fromSyntax
               (Scope *scope,DefParamSyntax *syntax,
               SmallVectorBase<const_slang::ast::DefParamSymbol_*> *results)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  Compilation *pCVar2;
  __extent_storage<18446744073709551615UL> node;
  Scope *in_RDI;
  Token TVar3;
  DefParamSymbol *sym;
  DefParamAssignmentSyntax *assignment;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *__range2;
  Compilation *comp;
  Compilation *in_stack_ffffffffffffff68;
  DefParamSymbol *in_stack_ffffffffffffff70;
  Scope *in_stack_ffffffffffffff78;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  *in_stack_ffffffffffffff80;
  Scope *scope_00;
  SourceLocation in_stack_ffffffffffffffa0;
  DefParamSymbol *pDVar4;
  
  pCVar2 = Scope::getCompilation(in_RDI);
  slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *)0x103729c);
  slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *)0x10372b0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::iterator_base<const_slang::syntax::DefParamAssignmentSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffff70,
                       (iterator_base<const_slang::syntax::DefParamAssignmentSyntax_*> *)
                       in_stack_ffffffffffffff68);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    node._M_extent_value =
         (size_t)iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::iterator_base<const_slang::syntax::DefParamAssignmentSyntax_*>,_false>
                 ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::iterator_base<const_slang::syntax::DefParamAssignmentSyntax_*>,_false>
                              *)0x10372de);
    in_stack_ffffffffffffff68 = pCVar2;
    TVar3 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_ffffffffffffffa0);
    scope_00 = (Scope *)TVar3.info;
    in_stack_ffffffffffffffa0 = parsing::Token::location((Token *)&stack0xffffffffffffff90);
    in_stack_ffffffffffffff70 =
         BumpAllocator::emplace<slang::ast::DefParamSymbol,slang::SourceLocation>
                   ((BumpAllocator *)in_stack_ffffffffffffff80,
                    (SourceLocation *)in_stack_ffffffffffffff78);
    Symbol::setSyntax(&in_stack_ffffffffffffff70->super_Symbol,(SyntaxNode *)node._M_extent_value);
    in_stack_ffffffffffffff78 = in_RDI;
    pDVar4 = in_stack_ffffffffffffff70;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              (in_stack_ffffffffffffff80,
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDI);
    syntax_00._M_extent._M_extent_value = node._M_extent_value;
    syntax_00._M_ptr = (pointer)pDVar4;
    Symbol::setAttributes((Symbol *)in_stack_ffffffffffffffa0,scope_00,syntax_00);
    SmallVectorBase<const_slang::ast::DefParamSymbol_*>::push_back
              ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)in_stack_ffffffffffffff70,
               (DefParamSymbol **)in_stack_ffffffffffffff68);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::iterator_base<const_slang::syntax::DefParamAssignmentSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::iterator_base<const_slang::syntax::DefParamAssignmentSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>::iterator_base<const_slang::syntax::DefParamAssignmentSyntax_*>,_false>
                *)in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void DefParamSymbol::fromSyntax(const Scope& scope, const DefParamSyntax& syntax,
                                SmallVectorBase<const DefParamSymbol*>& results) {
    auto& comp = scope.getCompilation();
    for (auto assignment : syntax.assignments) {
        auto sym = comp.emplace<DefParamSymbol>(assignment->getFirstToken().location());
        sym->setSyntax(*assignment);
        sym->setAttributes(scope, syntax.attributes);
        results.push_back(sym);
    }
}